

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryption.cc
# Opt level: O1

fdb_status fdb_init_encryptor(encryptor *e,fdb_encryption_key *key)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  fdb_encryption_algorithm_t fVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  fdb_status fVar9;
  encryption_ops **ppeVar10;
  encryption_ops *peVar11;
  
  iVar1 = key->algorithm;
  if (iVar1 == -1) {
    ppeVar10 = &fdb_encryption_ops_bogus;
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 == 0) {
        e->ops = (encryption_ops *)0x0;
        return FDB_RESULT_SUCCESS;
      }
      peVar11 = (encryption_ops *)0x0;
      goto LAB_00106915;
    }
    ppeVar10 = &fdb_encryption_ops_aes;
  }
  peVar11 = *ppeVar10;
LAB_00106915:
  e->ops = peVar11;
  if (peVar11 != (encryption_ops *)0x0) {
    *(undefined4 *)((e->key).bytes + 0x1c) = *(undefined4 *)(key->bytes + 0x1c);
    fVar4 = key->algorithm;
    uVar5 = key->bytes[0];
    uVar6 = key->bytes[1];
    uVar7 = key->bytes[2];
    uVar8 = key->bytes[3];
    uVar2 = *(undefined8 *)(key->bytes + 4);
    uVar3 = *(undefined8 *)(key->bytes + 0x14);
    *(undefined8 *)((e->key).bytes + 0xc) = *(undefined8 *)(key->bytes + 0xc);
    *(undefined8 *)((e->key).bytes + 0x14) = uVar3;
    (e->key).algorithm = fVar4;
    (e->key).bytes[0] = uVar5;
    (e->key).bytes[1] = uVar6;
    (e->key).bytes[2] = uVar7;
    (e->key).bytes[3] = uVar8;
    *(undefined8 *)((e->key).bytes + 4) = uVar2;
    fVar9 = (*peVar11->setup)(e);
    return fVar9;
  }
  return FDB_RESULT_CRYPTO_ERROR;
}

Assistant:

fdb_status fdb_init_encryptor(encryptor *e,
                              const fdb_encryption_key *key)
{
    if (key->algorithm == FDB_ENCRYPTION_NONE) {
        e->ops = NULL;
        return FDB_RESULT_SUCCESS;
    }
#ifdef FDB_LOG_CRYPTO
    fprintf(stderr, "CRYPT: Initializing context for key %d:%llx\n",
            key->algorithm, *(uint64_t*)key->bytes);
#endif
    e->ops = get_encryption_ops(key->algorithm);
    if (!e->ops)
        return FDB_RESULT_CRYPTO_ERROR; // unsupported algorithm
    e->key = *key;
    return e->ops->setup(e);
}